

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O0

bool __thiscall
draco::ObjEncoder::EncodeToBuffer(ObjEncoder *this,PointCloud *pc,EncoderBuffer *out_buffer)

{
  bool bVar1;
  ObjEncoder *in_RDX;
  PointCloud *in_RSI;
  ObjEncoder *in_RDI;
  bool return_value;
  bool local_1;
  
  in_RDI->in_point_cloud_ = in_RSI;
  in_RDI->out_buffer_ = (EncoderBuffer *)in_RDX;
  bVar1 = EncodeInternal(in_RDI);
  return_value = SUB81((ulong)in_RDI >> 0x38,0);
  if (bVar1) {
    local_1 = ExitAndCleanup(in_RDX,return_value);
  }
  else {
    local_1 = ExitAndCleanup(in_RDX,return_value);
  }
  return local_1;
}

Assistant:

bool ObjEncoder::EncodeToBuffer(const PointCloud &pc,
                                EncoderBuffer *out_buffer) {
  in_point_cloud_ = &pc;
  out_buffer_ = out_buffer;
  if (!EncodeInternal()) {
    return ExitAndCleanup(false);
  }
  return ExitAndCleanup(true);
}